

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O2

btVector3 __thiscall
btRigidBody::computeGyroscopicForceExplicit(btRigidBody *this,btScalar maxGyroscopicForce)

{
  btTransform *this_00;
  btVector3 bVar1;
  btScalar __x;
  float fVar2;
  float fVar3;
  btVector3 inertiaLocal;
  btVector3 tmp;
  btMatrix3x3 inertiaTensorWorld;
  btVector3 local_d0;
  btVector3 local_c0;
  btMatrix3x3 local_b0;
  btMatrix3x3 local_80;
  btMatrix3x3 local_50;
  
  local_c0 = getLocalInertia(this);
  this_00 = &(this->super_btCollisionObject).m_worldTransform;
  btMatrix3x3::scaled(&this_00->m_basis,&local_c0);
  btMatrix3x3::transpose(&local_80,&this_00->m_basis);
  operator*(&local_50,&local_b0,&local_80);
  local_b0.m_el[0] = operator*(&local_50,&this->m_angularVelocity);
  local_d0 = btVector3::cross(&this->m_angularVelocity,local_b0.m_el);
  __x = btVector3::length2(&local_d0);
  if (maxGyroscopicForce * maxGyroscopicForce < __x) {
    if (__x < 0.0) {
      fVar2 = sqrtf(__x);
    }
    else {
      fVar2 = SQRT(__x);
    }
    bVar1.m_floats = local_d0.m_floats;
    fVar3 = (1.0 / fVar2) * maxGyroscopicForce;
    fVar2 = local_d0.m_floats[0];
    local_d0.m_floats[1] = fVar3 * local_d0.m_floats[1];
    local_d0.m_floats[0] = fVar3 * fVar2;
    local_d0.m_floats[2] = bVar1.m_floats[2];
    local_d0.m_floats[3] = bVar1.m_floats[3];
    local_d0.m_floats[2] = fVar3 * local_d0.m_floats[2];
  }
  return (btVector3)local_d0.m_floats;
}

Assistant:

btVector3 btRigidBody::computeGyroscopicForceExplicit(btScalar maxGyroscopicForce) const
{
	btVector3 inertiaLocal = getLocalInertia();
	btMatrix3x3 inertiaTensorWorld = getWorldTransform().getBasis().scaled(inertiaLocal) * getWorldTransform().getBasis().transpose();
	btVector3 tmp = inertiaTensorWorld*getAngularVelocity();
	btVector3 gf = getAngularVelocity().cross(tmp);
	btScalar l2 = gf.length2();
	if (l2>maxGyroscopicForce*maxGyroscopicForce)
	{
		gf *= btScalar(1.)/btSqrt(l2)*maxGyroscopicForce;
	}
	return gf;
}